

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O3

void literal_clear(EditLine *el)

{
  ulong uVar1;
  
  if ((el->el_literal).l_len != 0) {
    if ((el->el_literal).l_idx != 0) {
      uVar1 = 0;
      do {
        free((el->el_literal).l_buf[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (el->el_literal).l_idx);
    }
    free((el->el_literal).l_buf);
    (el->el_literal).l_buf = (char **)0x0;
    (el->el_literal).l_idx = 0;
    (el->el_literal).l_len = 0;
  }
  return;
}

Assistant:

libedit_private void
literal_clear(EditLine *el)
{
	el_literal_t *l = &el->el_literal;
	size_t i;

	if (l->l_len == 0)
		return;

	for (i = 0; i < l->l_idx; i++)
		el_free(l->l_buf[i]);
	el_free(l->l_buf);
	l->l_buf = NULL;
	l->l_len = 0;
	l->l_idx = 0;
}